

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

uint32_t c_v256_movemask_8(c_v256 a)

{
  return (uint)(a.s8[0x1f] < '\0') << 0x1f | (uint)(a.s8[0x1e] < '\0') << 0x1e |
         (uint)(a.s8[0x1d] < '\0') << 0x1d | (uint)(a.s8[0x1c] < '\0') << 0x1c |
         (uint)(a.s8[0x1b] < '\0') << 0x1b | (uint)(a.s8[0x1a] < '\0') << 0x1a |
         (uint)(a.s8[0x19] < '\0') << 0x19 | (uint)(a.s8[0x18] < '\0') << 0x18 |
         (uint)(a.s8[0x17] < '\0') << 0x17 | (uint)(a.s8[0x16] < '\0') << 0x16 |
         (uint)(a.s8[0x15] < '\0') << 0x15 | (uint)(a.s8[0x14] < '\0') << 0x14 |
         (uint)(a.s8[0x13] < '\0') << 0x13 | (uint)(a.s8[0x12] < '\0') << 0x12 |
         (uint)(a.s8[0x11] < '\0') << 0x11 | (uint)(a.s8[0x10] < '\0') << 0x10 |
         (uint)(a.s8[0xf] < '\0') << 0xf | (uint)(a.s8[0xe] < '\0') << 0xe |
         (uint)(a.s8[0xd] < '\0') << 0xd | (uint)(a.s8[0xc] < '\0') << 0xc |
         (uint)(a.s8[0xb] < '\0') << 0xb | (uint)(a.s8[10] < '\0') << 10 |
         (uint)(a.s8[9] < '\0') << 9 | (uint)(a.s8[8] < '\0') << 8 | (uint)(a.s8[7] < '\0') << 7 |
         (uint)(a.s8[6] < '\0') << 6 | (uint)(a.s8[5] < '\0') << 5 | (uint)(a.s8[4] < '\0') << 4 |
         (uint)(a.s8[3] < '\0') << 3 | (uint)(a.s8[2] < '\0') << 2 | (uint)(a.s8[1] < '\0') << 1 |
         (uint)(a.s8[0] < '\0');
}

Assistant:

SIMD_INLINE uint32_t c_v256_movemask_8(c_v256 a) {
  return ((uint32_t)(a.s8[31] < 0) << 31) | ((a.s8[30] < 0) << 30) |
         ((a.s8[29] < 0) << 29) | ((a.s8[28] < 0) << 28) |
         ((a.s8[27] < 0) << 27) | ((a.s8[26] < 0) << 26) |
         ((a.s8[25] < 0) << 25) | ((a.s8[24] < 0) << 24) |
         ((a.s8[23] < 0) << 23) | ((a.s8[22] < 0) << 22) |
         ((a.s8[21] < 0) << 21) | ((a.s8[20] < 0) << 20) |
         ((a.s8[19] < 0) << 19) | ((a.s8[18] < 0) << 18) |
         ((a.s8[17] < 0) << 17) | ((a.s8[16] < 0) << 16) |
         ((a.s8[15] < 0) << 15) | ((a.s8[14] < 0) << 14) |
         ((a.s8[13] < 0) << 13) | ((a.s8[12] < 0) << 12) |
         ((a.s8[11] < 0) << 11) | ((a.s8[10] < 0) << 10) |
         ((a.s8[9] < 0) << 9) | ((a.s8[8] < 0) << 8) | ((a.s8[7] < 0) << 7) |
         ((a.s8[6] < 0) << 6) | ((a.s8[5] < 0) << 5) | ((a.s8[4] < 0) << 4) |
         ((a.s8[3] < 0) << 3) | ((a.s8[2] < 0) << 2) | ((a.s8[1] < 0) << 1) |
         ((a.s8[0] < 0) << 0);
}